

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

VectorStringBuffer * duckdb::StringVector::GetStringBuffer(Vector *vector)

{
  VectorStringBuffer *pVVar1;
  InternalException *this;
  allocator local_51;
  string local_50;
  LogicalType local_30;
  
  if ((vector->type).physical_type_ == VARCHAR) {
    pVVar1 = (VectorStringBuffer *)
             (vector->auxiliary).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pVVar1 == (VectorStringBuffer *)0x0) {
      make_shared_ptr<duckdb::VectorStringBuffer>();
      shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::VectorStringBuffer,_0>
                (&vector->auxiliary,(shared_ptr<duckdb::VectorStringBuffer,_true> *)&local_50);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      pVVar1 = (VectorStringBuffer *)
               (vector->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    return pVVar1;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "StringVector::GetStringBuffer - vector is not of internal type VARCHAR but of type %s"
             ,&local_51);
  LogicalType::LogicalType(&local_30,&vector->type);
  InternalException::InternalException<duckdb::LogicalType>(this,&local_50,&local_30);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

VectorStringBuffer &StringVector::GetStringBuffer(Vector &vector) {
	if (vector.GetType().InternalType() != PhysicalType::VARCHAR) {
		throw InternalException("StringVector::GetStringBuffer - vector is not of internal type VARCHAR but of type %s",
		                        vector.GetType());
	}
	if (!vector.auxiliary) {
		vector.auxiliary = make_buffer<VectorStringBuffer>();
	}
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::STRING_BUFFER);
	return vector.auxiliary.get()->Cast<VectorStringBuffer>();
}